

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::PathDeclarationSyntax::getChild(PathDeclarationSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff68;
  Info *in_stack_ffffffffffffff70;
  nullptr_t in_stack_ffffffffffffff78;
  ConstTokenOrSyntax *in_stack_ffffffffffffff80;
  
  switch(in_RDX) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    break;
  case 1:
    not_null<slang::syntax::PathDescriptionSyntax_*>::get
              ((not_null<slang::syntax::PathDescriptionSyntax_*> *)(in_RSI + 0x50));
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    break;
  case 2:
    token.info = in_stack_ffffffffffffff70;
    token._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x7bb2b8,token);
    break;
  case 3:
    token_00.info = in_stack_ffffffffffffff70;
    token_00._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x7bb2e8,token_00);
    break;
  case 4:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x78),in_stack_ffffffffffffff68);
    break;
  case 5:
    token_01.info = in_stack_ffffffffffffff70;
    token_01._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x7bb358,token_01);
    break;
  case 6:
    token_02.info = in_stack_ffffffffffffff70;
    token_02._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x7bb38b,token_02);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax PathDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return desc.get();
        case 2: return equals;
        case 3: return openParen;
        case 4: return &delays;
        case 5: return closeParen;
        case 6: return semi;
        default: return nullptr;
    }
}